

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void UpdateSizeHint(BrotliEncoderState *s,size_t available_in)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((s->params).size_hint != 0) {
    return;
  }
  uVar1 = s->input_pos_ - s->last_processed_pos_;
  uVar2 = uVar1 + available_in;
  if (0x3fffffff < uVar2) {
    uVar2 = 0x40000000;
  }
  if (0x3fffffff < (uVar1 | available_in)) {
    uVar2 = 0x40000000;
  }
  (s->params).size_hint = uVar2;
  return;
}

Assistant:

static void UpdateSizeHint(BrotliEncoderState* s, size_t available_in) {
  if (s->params.size_hint == 0) {
    uint64_t delta = UnprocessedInputSize(s);
    uint64_t tail = available_in;
    uint32_t limit = 1u << 30;
    uint32_t total;
    if ((delta >= limit) || (tail >= limit) || ((delta + tail) >= limit)) {
      total = limit;
    } else {
      total = (uint32_t)(delta + tail);
    }
    s->params.size_hint = total;
  }
}